

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_show_aqr(REF_INT m,REF_INT n,REF_DBL *a,REF_DBL *q,REF_DBL *r)

{
  int local_30;
  int local_2c;
  REF_INT col;
  REF_INT row;
  REF_DBL *r_local;
  REF_DBL *q_local;
  REF_DBL *a_local;
  REF_INT n_local;
  REF_INT m_local;
  
  if (a != (REF_DBL *)0x0) {
    printf("A\n");
    for (local_2c = 0; local_2c < m; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
        printf(" %12.4e",a[local_2c + m * local_30]);
      }
      printf("\n");
    }
  }
  printf("Q\n");
  for (local_2c = 0; local_2c < m; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
      printf(" %12.4e",q[local_2c + m * local_30]);
    }
    printf("\n");
  }
  printf("R\n");
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
      printf(" %12.4e",r[local_2c + n * local_30]);
    }
    printf("\n");
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_aqr(REF_INT m, REF_INT n, REF_DBL *a,
                                       REF_DBL *q, REF_DBL *r) {
  REF_INT row, col;

  if (NULL != a) {
    printf("A\n");
    for (row = 0; row < m; row++) {
      for (col = 0; col < n; col++) {
        printf(" %12.4e", a[row + m * col]);
      }
      printf("\n");
    }
  }
  printf("Q\n");
  for (row = 0; row < m; row++) {
    for (col = 0; col < n; col++) {
      printf(" %12.4e", q[row + m * col]);
    }
    printf("\n");
  }
  printf("R\n");
  for (row = 0; row < n; row++) {
    for (col = 0; col < n; col++) {
      printf(" %12.4e", r[row + n * col]);
    }
    printf("\n");
  }

  return REF_SUCCESS;
}